

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_affine.h
# Opt level: O2

longdouble * __thiscall
mp::LinTerms::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (longdouble *__return_storage_ptr__,LinTerms *this,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  longdouble *extraout_RAX;
  longdouble *plVar1;
  longdouble *extraout_RAX_00;
  long lVar2;
  bool bVar3;
  _Vector_base<int,_std::allocator<int>_> local_88;
  undefined8 local_70;
  undefined8 local_68;
  _Vector_base<double,_std::allocator<double>_> local_58;
  undefined8 local_40;
  long local_38;
  
  local_40 = *(undefined8 *)__return_storage_ptr__;
  lVar2 = *(long *)(__return_storage_ptr__ + 1);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = lVar2;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
  plVar1 = extraout_RAX;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    local_40 = *(undefined8 *)__return_storage_ptr__;
    local_38 = *(long *)(__return_storage_ptr__ + 1);
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70 = *(undefined8 *)((long)__return_storage_ptr__ + 0x48);
    local_68 = *(undefined8 *)((long)__return_storage_ptr__ + 0x58);
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
    plVar1 = extraout_RAX_00;
  }
  return plVar1;
}

Assistant:

long double ComputeValue(const VarInfo& x) const {
    long double s=0.0;
    for (size_t i=coefs().size(); i--; )
      s += (long double)(coefs()[i]) * x[vars()[i]];
    return s;
  }